

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

GLuint __thiscall
glcts::FormatInfo::countAlignedSize(FormatInfo *this,GLuint offsetAlignment,GLuint totalSize)

{
  GLuint rest;
  GLuint totalSize_local;
  GLuint offsetAlignment_local;
  FormatInfo *this_local;
  
  this_local._4_4_ = offsetAlignment;
  if ((offsetAlignment < totalSize) &&
     (this_local._4_4_ = totalSize, totalSize % offsetAlignment != 0)) {
    this_local._4_4_ = (totalSize + offsetAlignment) - totalSize % offsetAlignment;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLuint FormatInfo::countAlignedSize(glw::GLuint offsetAlignment, glw::GLuint totalSize)
{
	if (totalSize > offsetAlignment)
	{
		glw::GLuint rest = totalSize % offsetAlignment;
		if (0 == rest)
		{
			return totalSize;
		}
		return totalSize + offsetAlignment - rest;
	}
	else
	{
		return offsetAlignment;
	}
}